

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_ge_x_on_curve_var(secp256k1_fe *x)

{
  int iVar1;
  secp256k1_fe c;
  
  secp256k1_fe_sqr(&c,x);
  secp256k1_fe_mul(&c,&c,x);
  secp256k1_fe_add_int(&c,7);
  iVar1 = secp256k1_fe_is_square_var(&c);
  return iVar1;
}

Assistant:

static int secp256k1_ge_x_on_curve_var(const secp256k1_fe *x) {
    secp256k1_fe c;
    secp256k1_fe_sqr(&c, x);
    secp256k1_fe_mul(&c, &c, x);
    secp256k1_fe_add_int(&c, SECP256K1_B);
    return secp256k1_fe_is_square_var(&c);
}